

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParser.cpp
# Opt level: O0

void __thiscall
AutoArgParse::FlagStore::printUsageHelp(FlagStore *this,ostream *os,IndentedLine *lineIndent)

{
  bool bVar1;
  reference this_00;
  long lVar2;
  pointer pAVar3;
  ostream *poVar4;
  unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_> *argPtr;
  const_iterator __end1;
  const_iterator __begin1;
  ArgVector *__range1;
  IndentedLine *lineIndent_local;
  ostream *os_local;
  FlagStore *this_local;
  
  lineIndent->indentLevel = lineIndent->indentLevel + 1;
  __end1 = std::
           vector<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>
           ::begin(&this->args);
  argPtr = (unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_> *)
           std::
           vector<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>
           ::end(&this->args);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_*,_std::vector<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>_>
                                *)&argPtr);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_*,_std::vector<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>_>
              ::operator*(&__end1);
    std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>::operator->
              (this_00);
    lVar2 = std::__cxx11::string::size();
    if (lVar2 != 0) {
      operator<<(os,lineIndent);
      pAVar3 = std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>::
               operator->(this_00);
      std::operator<<(os,(string *)&pAVar3->name);
      pAVar3 = std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>::
               operator->(this_00);
      if ((pAVar3->super_ParseToken).policy == OPTIONAL) {
        std::operator<<(os," [optional]");
      }
      poVar4 = std::operator<<((ostream *)&std::cout,": ");
      pAVar3 = std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>::
               operator->(this_00);
      std::operator<<(poVar4,(string *)&(pAVar3->super_ParseToken).description);
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_*,_std::vector<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>_>
    ::operator++(&__end1);
  }
  AutoArgParse::printUsageHelp(&this->flagInsertionOrder,&this->flags,os,lineIndent);
  lineIndent->indentLevel = lineIndent->indentLevel + -1;
  return;
}

Assistant:

AUTOARGPARSE_INLINE void FlagStore::printUsageHelp(
    std::ostream& os, IndentedLine& lineIndent) const {
    lineIndent.indentLevel++;
    for (auto& argPtr : args) {
        if (argPtr->description.size() > 0) {
            os << lineIndent;
            os << argPtr->name;
            if (argPtr->policy == Policy::OPTIONAL) {
                os << " [optional]";
            }
            std::cout << ": " << argPtr->description;
        }
    }
    AutoArgParse::printUsageHelp(flagInsertionOrder, flags, os, lineIndent);
    lineIndent.indentLevel--;
}